

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyNodeIsProp(TidyDoc tdoc,TidyNode tnod)

{
  uint uVar1;
  Bool local_2c;
  Bool isProprietary;
  Node *nimp;
  TidyNode tnod_local;
  TidyDoc tdoc_local;
  
  if (tnod == (TidyNode)0x0) {
    return yes;
  }
  uVar1 = tnod[0x14]._opaque;
  if (4 < uVar1) {
    if (uVar1 - 5 < 3) {
      if (*(long *)(tnod + 0xe) == 0) {
        local_2c = yes;
      }
      else {
        local_2c = (Bool)((*(uint *)(*(long *)(tnod + 0xe) + 0x10) & 0xe000) != 0);
      }
      return local_2c;
    }
    if (uVar1 != 8) {
      if (uVar1 - 9 < 4) {
        return yes;
      }
      if (uVar1 != 0xd) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

Bool TIDY_CALL tidyNodeIsProp( TidyDoc ARG_UNUSED(tdoc), TidyNode tnod )
{
  Node* nimp = tidyNodeToImpl( tnod );
  Bool isProprietary = yes;
  if ( nimp )
  {
    switch ( nimp->type )
    {
    case RootNode:
    case DocTypeTag:
    case CommentTag:
    case XmlDecl:
    case ProcInsTag:
    case TextNode:
    case CDATATag:
        isProprietary = no;
        break;

    case SectionTag:
    case AspTag:
    case JsteTag:
    case PhpTag:
        isProprietary = yes;
        break;

    case StartTag:
    case EndTag:
    case StartEndTag:
        isProprietary = ( nimp->tag
                          ? (nimp->tag->versions&VERS_PROPRIETARY)!=0
                          : yes );
        break;
    }
  }
  return isProprietary;
}